

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

void __thiscall kj::Path::Path(Path *this,ArrayPtr<const_kj::StringPtr> parts)

{
  size_t sVar1;
  StringPtr *pSVar2;
  String *pSVar3;
  StringPtr *pSVar4;
  Array<kj::String> result;
  Array<kj::String> local_88;
  String *local_68;
  String *local_60;
  String *local_58;
  undefined8 *local_50;
  String local_48;
  
  sVar1 = parts.size_;
  pSVar2 = parts.ptr;
  local_88.ptr = (String *)
                 _::HeapArrayDisposer::allocateImpl
                           (0x18,0,sVar1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_58 = local_88.ptr + sVar1;
  local_50 = &_::HeapArrayDisposer::instance;
  pSVar3 = local_88.ptr;
  local_68 = local_88.ptr;
  if (sVar1 != 0) {
    pSVar4 = pSVar2 + sVar1;
    do {
      local_60 = pSVar3;
      heapString(&local_48,(pSVar2->content).ptr,(pSVar2->content).size_ - 1);
      (pSVar3->content).ptr = local_48.content.ptr;
      (pSVar3->content).size_ = local_48.content.size_;
      (pSVar3->content).disposer = local_48.content.disposer;
      pSVar3 = pSVar3 + 1;
      pSVar2 = pSVar2 + 1;
    } while (pSVar2 != pSVar4);
  }
  local_88.size_ = ((long)pSVar3 - (long)local_88.ptr >> 3) * -0x5555555555555555;
  local_88.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_60 = pSVar3;
  Path(this,&local_88);
  sVar1 = local_88.size_;
  pSVar3 = local_88.ptr;
  if (local_88.ptr != (String *)0x0) {
    local_88.ptr = (String *)0x0;
    local_88.size_ = 0;
    (**(local_88.disposer)->_vptr_ArrayDisposer)
              (local_88.disposer,pSVar3,0x18,sVar1,sVar1,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  return;
}

Assistant:

Path::Path(ArrayPtr<const StringPtr> parts)
    : Path(KJ_MAP(p, parts) { return heapString(p); }) {}